

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O2

char * testing::internal::StringFromGTestEnv(char *flag,char *default_value)

{
  char *pcVar1;
  char *unaff_RBX;
  string env_var;
  undefined8 local_38;
  
  FlagToEnvVar_abi_cxx11_(unaff_RBX);
  pcVar1 = getenv(local_38);
  if (pcVar1 == (char *)0x0) {
    pcVar1 = default_value;
  }
  std::__cxx11::string::_M_dispose();
  return pcVar1;
}

Assistant:

const char* StringFromGTestEnv(const char* flag, const char* default_value) {
#if defined(GTEST_GET_STRING_FROM_ENV_)
  return GTEST_GET_STRING_FROM_ENV_(flag, default_value);
#else
  const std::string env_var = FlagToEnvVar(flag);
  const char* const value = posix::GetEnv(env_var.c_str());
  return value == NULL ? default_value : value;
#endif  // defined(GTEST_GET_STRING_FROM_ENV_)
}